

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

RealType __thiscall OpenMD::Molecule::getPotential(Molecule *this)

{
  RealType RVar1;
  RealType potential;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  double local_50;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_48;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  in_stack_ffffffffffffffd0;
  Inversion *local_28;
  Torsion *local_20;
  Bend *local_18;
  Bond *local_10;
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
                       *)&stack0xffffffffffffffd0);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
                       *)&stack0xffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_48);
  local_50 = 0.0;
  local_10 = beginBond((Molecule *)in_stack_ffffffffffffffd0._M_current,
                       (iterator *)in_stack_ffffffffffffffc8._M_current);
  while (local_10 != (Bond *)0x0) {
    RVar1 = Bond::getPotential(local_10);
    local_50 = RVar1 + local_50;
    local_10 = nextBond((Molecule *)in_stack_ffffffffffffffd0._M_current,
                        (iterator *)in_stack_ffffffffffffffc8._M_current);
  }
  local_18 = beginBend((Molecule *)in_stack_ffffffffffffffd0._M_current,
                       (iterator *)in_stack_ffffffffffffffc8._M_current);
  while (local_18 != (Bend *)0x0) {
    RVar1 = Bend::getPotential(local_18);
    local_50 = RVar1 + local_50;
    local_18 = nextBend((Molecule *)in_stack_ffffffffffffffd0._M_current,
                        (iterator *)in_stack_ffffffffffffffc8._M_current);
  }
  local_20 = beginTorsion((Molecule *)in_stack_ffffffffffffffd0._M_current,
                          (iterator *)in_stack_ffffffffffffffc8._M_current);
  while (local_20 != (Torsion *)0x0) {
    RVar1 = Torsion::getPotential(local_20);
    local_50 = RVar1 + local_50;
    local_20 = nextTorsion((Molecule *)in_stack_ffffffffffffffd0._M_current,
                           (iterator *)in_stack_ffffffffffffffc8._M_current);
  }
  local_28 = beginInversion((Molecule *)in_stack_ffffffffffffffd0._M_current,
                            (iterator *)in_stack_ffffffffffffffc8._M_current);
  while (local_28 != (Inversion *)0x0) {
    RVar1 = Inversion::getPotential(local_28);
    local_50 = RVar1 + local_50;
    local_28 = nextInversion((Molecule *)in_stack_ffffffffffffffd0._M_current,
                             (iterator *)in_stack_ffffffffffffffc8._M_current);
  }
  return local_50;
}

Assistant:

RealType Molecule::getPotential() {
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    Molecule::BondIterator bondIter;
    ;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    RealType potential = 0.0;

    for (bond = beginBond(bondIter); bond != NULL; bond = nextBond(bondIter)) {
      potential += bond->getPotential();
    }

    for (bend = beginBend(bendIter); bend != NULL; bend = nextBend(bendIter)) {
      potential += bend->getPotential();
    }

    for (torsion = beginTorsion(torsionIter); torsion != NULL;
         torsion = nextTorsion(torsionIter)) {
      potential += torsion->getPotential();
    }

    for (inversion = beginInversion(inversionIter); inversion != NULL;
         inversion = nextInversion(inversionIter)) {
      potential += inversion->getPotential();
    }

    return potential;
  }